

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

void __thiscall
cfd::core::Psbt::SetTxInSighashType(Psbt *this,uint32_t index,SigHashType *sighash_type)

{
  CfdException *this_00;
  allocator local_69;
  string local_68;
  CfdSourceLocation local_48;
  int local_30;
  uint32_t local_2c;
  int ret;
  uint32_t sighash;
  wally_psbt *psbt_pointer;
  SigHashType *sighash_type_local;
  Psbt *pPStack_10;
  uint32_t index_local;
  Psbt *this_local;
  
  psbt_pointer = (wally_psbt *)sighash_type;
  sighash_type_local._4_4_ = index;
  pPStack_10 = this;
  (*this->_vptr_Psbt[2])(this,(ulong)index,0x964,"SetTxInSighashType");
  _ret = this->wally_psbt_pointer_;
  local_2c = SigHashType::GetSigHashFlag((SigHashType *)psbt_pointer);
  local_30 = wally_psbt_input_set_sighash
                       (*(long *)((long)_ret + 0x10) + (ulong)sighash_type_local._4_4_ * 0x110,
                        local_2c);
  if (local_30 != 0) {
    local_48.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_48.filename = local_48.filename + 1;
    local_48.line = 0x96c;
    local_48.funcname = "SetTxInSighashType";
    logger::warn<int&>(&local_48,"wally_psbt_input_set_sighash NG[{}]",&local_30);
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_68,"psbt set input sighash error.",&local_69);
    CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_68);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return;
}

Assistant:

void Psbt::SetTxInSighashType(
    uint32_t index, const SigHashType &sighash_type) {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  uint32_t sighash = sighash_type.GetSigHashFlag();

  int ret =
      wally_psbt_input_set_sighash(&psbt_pointer->inputs[index], sighash);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_input_set_sighash NG[{}]", ret);
    throw CfdException(
        kCfdIllegalArgumentError, "psbt set input sighash error.");
  }
}